

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

int __thiscall
ON_Xform::DecomposeSimilarity
          (ON_Xform *this,ON_3dVector *T,double *dilation,ON_Xform *R,double tolerance)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  ON_Interval OVar4;
  double err;
  double dStack_2a8;
  int i;
  double l1;
  double l0;
  int maxi;
  int mini;
  ON_3dVector Ttrash;
  ON_3dVector lambda;
  ON_Xform Q;
  ON_Xform local_160;
  double local_e0;
  double det;
  double dist;
  ON_Interval Spectrum;
  double OrthogonalTol;
  ON_Xform L;
  int rval;
  double tolerance_local;
  ON_Xform *R_local;
  double *dilation_local;
  ON_3dVector *T_local;
  ON_Xform *this_local;
  
  L.m_xform[3][3]._4_4_ = 0;
  bVar1 = IsAffine(this);
  if (bVar1) {
    ON_Xform((ON_Xform *)&OrthogonalTol);
    DecomposeAffine(this,T,(ON_Xform *)&OrthogonalTol);
    Spectrum.m_t[1] = 2.220446049250313e-14;
    OVar4 = ApproxSpectrumLTL((ON_Xform *)&OrthogonalTol);
    dist = OVar4.m_t[0];
    Spectrum.m_t[0] = OVar4.m_t[1];
    dVar3 = ON_Interval::Length((ON_Interval *)&dist);
    det = dVar3 / 2.0;
    if (2.220446049250313e-14 <= det) {
      if ((det < tolerance * 10.0) || (1.0 < tolerance)) {
        ON_Xform((ON_Xform *)&lambda.z);
        bVar1 = DecomposeAffine((ON_Xform *)&OrthogonalTol,(ON_3dVector *)&maxi,R,
                                (ON_Xform *)&lambda.z,(ON_3dVector *)&Ttrash.z);
        if (bVar1) {
          l0._4_4_ = 0;
          l0._0_4_ = 0;
          l1 = 1.79769313486232e+308;
          dStack_2a8 = 2.2250738585072014e-308;
          for (err._4_4_ = 0; err._4_4_ < 3; err._4_4_ = err._4_4_ + 1) {
            pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&Ttrash.z,err._4_4_);
            if (*pdVar2 < l1) {
              l0._4_4_ = err._4_4_;
              pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&Ttrash.z,err._4_4_);
              l1 = *pdVar2;
            }
            pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&Ttrash.z,err._4_4_);
            if (dStack_2a8 < *pdVar2) {
              l0._0_4_ = err._4_4_;
              pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&Ttrash.z,err._4_4_);
              dStack_2a8 = *pdVar2;
            }
          }
          pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&Ttrash.z,l0._0_4_);
          dVar3 = *pdVar2;
          pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&Ttrash.z,l0._4_4_);
          if ((dVar3 - *pdVar2) / 2.0 <= tolerance) {
            pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&Ttrash.z,l0._4_4_);
            dVar3 = *pdVar2;
            pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&Ttrash.z,l0._0_4_);
            *dilation = (dVar3 + *pdVar2) / 2.0;
            L.m_xform[3][3]._4_4_ = -1;
            if (0.0 < *dilation) {
              L.m_xform[3][3]._4_4_ = 1;
            }
          }
          else {
            L.m_xform[3][3]._4_4_ = 0;
          }
        }
      }
    }
    else {
      local_e0 = Determinant((ON_Xform *)&OrthogonalTol,(double *)0x0);
      dVar3 = pow(ABS(local_e0),0.3333333333333333);
      *dilation = dVar3;
      if (local_e0 < 0.0) {
        *dilation = *dilation * -1.0;
      }
      ON_Xform((ON_Xform *)(Q.m_xform[3] + 3),1.0 / *dilation);
      operator*(&local_160,(ON_Xform *)(Q.m_xform[3] + 3),(ON_Xform *)&OrthogonalTol);
      memcpy(R,&local_160,0x80);
      Orthogonalize(R,2.220446049250313e-15);
      L.m_xform[3][3]._4_4_ = -1;
      if (0.0 < local_e0) {
        L.m_xform[3][3]._4_4_ = 1;
      }
    }
  }
  return L.m_xform[3][3]._4_4_;
}

Assistant:

int ON_Xform::DecomposeSimilarity(ON_3dVector& T, double& dilation, ON_Xform& R, double tolerance) const
{
	int rval = 0;
	if (IsAffine())
	{
		ON_Xform L;
		DecomposeAffine(T, L);

		/* Three cases:
		I. L is within OrthogonalTol of being orthogonal then just return R = Linear
		(this is an optimization to avoid doing an eigen solve)
		II. Linear<10*tolerance or tol>1.0 then find the closest orthogonal matrix R.
		test the final solution to see if |*this-R|<tolerance .
		III. Otherwise return 0
		*/
		const double OrthogonalTol = 100 * ON_EPSILON;

		ON_Interval Spectrum = ApproxSpectrumLTL(L);

		double dist = Spectrum.Length()/2.0;
		if (dist<OrthogonalTol)
		{
			// Case I.
			double det = L.Determinant();
			dilation = pow(fabs(det), 1.0 / 3.0);
			if (det < 0)
				dilation *= -1.0;
			R = ON_Xform(1.0 / dilation)*L;
			R.Orthogonalize(10*ON_EPSILON);			// tune-it up.
			rval = (det > 0) ? 1 : -1;
		}

		else if (dist < 10 * tolerance || tolerance>1.0)
		{
			// Case II.
			ON_Xform Q;		// ortho change of coordinate matrix
			ON_3dVector lambda;
			ON_3dVector Ttrash;
			if (L.DecomposeAffine(Ttrash, R, Q, lambda))
			{
				// Find the min and max eigen-values
				int mini=0, maxi=0;
				double l0 = ON_DBL_MAX;
				double l1 = ON_DBL_MIN;
				for (int i = 0; i < 3; i++)
				{
					if (lambda[i] < l0)
					{
						mini = i; l0 = lambda[i];
					}
					if (l1< lambda[i])
					{
						maxi = i; l1 = lambda[i];
					}
				}
				double err = (lambda[maxi] - lambda[mini]) / 2.0;
				if (err > tolerance)
					rval = 0;
				else
				{
					dilation = (lambda[mini] + lambda[maxi]) / 2.0;
					rval = (dilation > 0) ? 1 : -1;
					//dilation;
				}
			}			
		}
	}
	return rval;
}